

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

path * __thiscall boost::filesystem::path::lexically_normal(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  iterator itr_1;
  iterator next;
  string_type lf;
  iterator last;
  iterator start;
  iterator stop;
  iterator local_140;
  iterator local_110;
  byte *local_e0;
  long local_d8;
  long local_d0 [2];
  path local_c0;
  path *local_a0;
  size_type local_98;
  iterator local_90;
  iterator local_60;
  
  sVar2 = (this->m_pathname)._M_string_length;
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  if (sVar2 == 0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,(this->m_pathname)._M_dataplus._M_p);
  }
  else {
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    begin(&local_90,this);
    local_c0.m_pathname._M_dataplus._M_p = (pointer)&local_c0.m_pathname.field_2;
    local_c0.m_pathname._M_string_length = 0;
    local_c0.m_pathname.field_2._M_local_buf[0] = '\0';
    local_98 = (this->m_pathname)._M_string_length;
    local_a0 = this;
    iterators::detail::
    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_true,_false>
    ::operator--(&local_60,
                 (iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_true,_false>
                  *)&local_c0,0);
    local_140.m_element.m_pathname._M_dataplus._M_p =
         (pointer)&local_140.m_element.m_pathname.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_90.m_element.m_pathname._M_dataplus._M_p,
               local_90.m_element.m_pathname._M_dataplus._M_p +
               local_90.m_element.m_pathname._M_string_length);
    local_140.m_path_ptr = local_90.m_path_ptr;
    local_140.m_pos = local_90.m_pos;
    paVar1 = &local_110.m_element.m_pathname.field_2;
    while ((local_140.m_path_ptr != local_60.m_path_ptr || (local_140.m_pos != local_60.m_pos))) {
      if (local_140.m_element.m_pathname._M_string_length == 1) {
        if (((*local_140.m_element.m_pathname._M_dataplus._M_p != '.') ||
            ((local_140.m_path_ptr == local_90.m_path_ptr && (local_140.m_pos == local_90.m_pos))))
           || ((local_140.m_path_ptr == local_a0 && (local_140.m_pos == local_98))))
        goto LAB_0011036b;
      }
      else {
        if ((((local_140.m_element.m_pathname._M_string_length == 2) &&
             ((__return_storage_ptr__->m_pathname)._M_string_length != 0)) &&
            (*local_140.m_element.m_pathname._M_dataplus._M_p == '.')) &&
           (local_140.m_element.m_pathname._M_dataplus._M_p[1] == '.')) {
          filename(&local_110.m_element,__return_storage_ptr__);
          local_e0 = (byte *)local_d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,local_110.m_element.m_pathname._M_dataplus._M_p,
                     local_110.m_element.m_pathname._M_dataplus._M_p +
                     local_110.m_element.m_pathname._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110.m_element.m_pathname._M_dataplus._M_p != paVar1) {
            operator_delete(local_110.m_element.m_pathname._M_dataplus._M_p,
                            local_110.m_element.m_pathname.field_2._M_allocated_capacity + 1);
          }
          bVar3 = true;
          if (local_d8 != 0) {
            if (local_d8 == 2) {
              if (*local_e0 != 0x2e) {
                bVar4 = local_e0[1];
                goto joined_r0x0011028f;
              }
            }
            else {
              if (local_d8 == 1) {
                bVar4 = *local_e0 & 0xfe;
joined_r0x0011028f:
                if (bVar4 == 0x2e) goto LAB_0011034f;
              }
              remove_filename(__return_storage_ptr__);
              local_110.m_element.m_pathname._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,local_140.m_element.m_pathname._M_dataplus._M_p,
                         local_140.m_element.m_pathname._M_dataplus._M_p +
                         local_140.m_element.m_pathname._M_string_length);
              local_110.m_path_ptr = local_140.m_path_ptr;
              local_110.m_pos = local_140.m_pos;
              if (((((__return_storage_ptr__->m_pathname)._M_string_length == 0) &&
                   ((m_path_iterator_increment(&local_110),
                    local_110.m_path_ptr != local_60.m_path_ptr ||
                    (local_110.m_pos != local_60.m_pos)))) && (local_110.m_path_ptr == local_a0)) &&
                 (local_110.m_pos == local_98)) {
                detail::dot_path();
                iVar5 = compare(&local_c0,&detail::dot_path::dot_pth);
                if (iVar5 == 0) {
                  detail::dot_path();
                  operator/=(__return_storage_ptr__,&detail::dot_path::dot_pth);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110.m_element.m_pathname._M_dataplus._M_p != paVar1) {
                operator_delete(local_110.m_element.m_pathname._M_dataplus._M_p,
                                local_110.m_element.m_pathname.field_2._M_allocated_capacity + 1);
              }
              bVar3 = false;
            }
          }
LAB_0011034f:
          if (local_e0 != (byte *)local_d0) {
            operator_delete(local_e0,local_d0[0] + 1);
          }
          if (!bVar3) goto LAB_00110376;
        }
LAB_0011036b:
        operator/=(__return_storage_ptr__,&local_140.m_element);
      }
LAB_00110376:
      m_path_iterator_increment(&local_140);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.m_element.m_pathname._M_dataplus._M_p !=
        &local_140.m_element.m_pathname.field_2) {
      operator_delete(local_140.m_element.m_pathname._M_dataplus._M_p,
                      local_140.m_element.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((__return_storage_ptr__->m_pathname)._M_string_length == 0) {
      detail::dot_path();
      operator/=(__return_storage_ptr__,&detail::dot_path::dot_pth);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.m_element.m_pathname._M_dataplus._M_p != &local_60.m_element.m_pathname.field_2)
    {
      operator_delete(local_60.m_element.m_pathname._M_dataplus._M_p,
                      local_60.m_element.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.m_pathname._M_dataplus._M_p != &local_c0.m_pathname.field_2) {
      operator_delete(local_c0.m_pathname._M_dataplus._M_p,
                      CONCAT71(local_c0.m_pathname.field_2._M_allocated_capacity._1_7_,
                               local_c0.m_pathname.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_element.m_pathname._M_dataplus._M_p != &local_90.m_element.m_pathname.field_2)
    {
      operator_delete(local_90.m_element.m_pathname._M_dataplus._M_p,
                      local_90.m_element.m_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path path::lexically_normal() const
  {
    if (m_pathname.empty())
      return *this;
      
    path temp;
    iterator start(begin());
    iterator last(end());
    iterator stop(last--);
    for (iterator itr(start); itr != stop; ++itr)
    {
      // ignore "." except at start and last
      if (itr->native().size() == 1
        && (itr->native())[0] == dot
        && itr != start
        && itr != last) continue;

      // ignore a name and following ".."
      if (!temp.empty()
        && itr->native().size() == 2
        && (itr->native())[0] == dot
        && (itr->native())[1] == dot) // dot dot
      {
        string_type lf(temp.filename().native());  
        if (lf.size() > 0  
          && (lf.size() != 1
            || (lf[0] != dot
              && lf[0] != separator))
          && (lf.size() != 2 
            || (lf[0] != dot
              && lf[1] != dot
#             ifdef BOOST_WINDOWS_API
              && lf[1] != colon
#             endif
               )
             )
          )
        {
          temp.remove_filename();
          //// if not root directory, must also remove "/" if any
          //if (temp.native().size() > 0
          //  && temp.native()[temp.native().size()-1]
          //    == separator)
          //{
          //  string_type::size_type rds(
          //    root_directory_start(temp.native(), temp.native().size()));
          //  if (rds == string_type::npos
          //    || rds != temp.native().size()-1) 
          //  {
          //    temp.m_pathname.erase(temp.native().size()-1);
          //  }
          //}

          iterator next(itr);
          if (temp.empty() && ++next != stop
            && next == last && *last == detail::dot_path())
          {
            temp /= detail::dot_path();
          }
          continue;
        }
      }

      temp /= *itr;
    };

    if (temp.empty())
      temp /= detail::dot_path();
    return temp;
  }